

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O1

void InvShiftRows(AES_state *s)

{
  undefined1 auVar1 [16];
  long lVar2;
  long in_FS_OFFSET;
  ushort uVar3;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  undefined1 auVar4 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  ushort uVar15;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  auVar1 = *(undefined1 (*) [16])s->slice;
  uVar3 = auVar1._0_2_;
  uVar5 = auVar1._2_2_;
  auVar13._2_2_ = uVar5 * 2;
  auVar13._0_2_ = uVar3 * 2;
  uVar6 = auVar1._4_2_;
  auVar13._4_2_ = uVar6 * 2;
  uVar7 = auVar1._6_2_;
  auVar13._6_2_ = uVar7 * 2;
  uVar8 = auVar1._8_2_;
  auVar13._8_2_ = uVar8 * 2;
  uVar9 = auVar1._10_2_;
  auVar13._10_2_ = uVar9 * 2;
  uVar10 = auVar1._12_2_;
  uVar15 = auVar1._14_2_;
  auVar13._12_2_ = uVar10 * 2;
  auVar13._14_2_ = uVar15 * 2;
  auVar11._0_2_ = uVar3 >> 3;
  auVar11._2_2_ = uVar5 >> 3;
  auVar11._4_2_ = uVar6 >> 3;
  auVar11._6_2_ = uVar7 >> 3;
  auVar11._8_2_ = uVar8 >> 3;
  auVar11._10_2_ = uVar9 >> 3;
  auVar11._12_2_ = uVar10 >> 3;
  auVar11._14_2_ = uVar15 >> 3;
  auVar16 = psllw(auVar1,2);
  auVar12._0_2_ = uVar3 >> 2;
  auVar12._2_2_ = uVar5 >> 2;
  auVar12._4_2_ = uVar6 >> 2;
  auVar12._6_2_ = uVar7 >> 2;
  auVar12._8_2_ = uVar8 >> 2;
  auVar12._10_2_ = uVar9 >> 2;
  auVar12._12_2_ = uVar10 >> 2;
  auVar12._14_2_ = uVar15 >> 2;
  auVar14 = psllw(auVar1,3);
  auVar4._0_2_ = uVar3 >> 1;
  auVar4._2_2_ = uVar5 >> 1;
  auVar4._4_2_ = uVar6 >> 1;
  auVar4._6_2_ = uVar7 >> 1;
  auVar4._8_2_ = uVar8 >> 1;
  auVar4._10_2_ = uVar9 >> 1;
  auVar4._12_2_ = uVar10 >> 1;
  auVar4._14_2_ = uVar15 >> 1;
  *(undefined1 (*) [16])s->slice =
       auVar4 & _DAT_011514a0 | auVar14 & _DAT_01151490 | auVar12 & _DAT_01151440 |
       auVar16 & _DAT_01151430 | auVar11 & _DAT_01151480 |
       auVar13 & _DAT_01151470 | _DAT_01151400 & auVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void InvShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 7, 1) | BIT_RANGE_RIGHT(v, 7, 8, 3) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 13, 3) | BIT_RANGE_RIGHT(v, 13, 16, 1);
    }
}